

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::MergeFromString(Parser *this,string *input,Message *output)

{
  char *size;
  bool bVar1;
  Message *extraout_RDX;
  Message *error_collector;
  StringPiece input_00;
  undefined1 local_48 [8];
  ArrayInputStream input_stream;
  
  size = (char *)input->_M_string_length;
  error_collector = output;
  if ((long)size < 0) {
    StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
    error_collector = extraout_RDX;
  }
  input_00.length_ = (stringpiece_ssize_type)this->error_collector_;
  input_00.ptr_ = size;
  bVar1 = anon_unknown_20::CheckParseInputSize(input_00,(ErrorCollector *)error_collector);
  if (bVar1) {
    io::ArrayInputStream::ArrayInputStream
              ((ArrayInputStream *)local_48,(input->_M_dataplus)._M_p,(int)input->_M_string_length,
               -1);
    bVar1 = Merge(this,(ZeroCopyInputStream *)local_48,output);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TextFormat::Parser::MergeFromString(const std::string& input,
                                         Message* output) {
  DO(CheckParseInputSize(input, error_collector_));
  io::ArrayInputStream input_stream(input.data(), input.size());
  return Merge(&input_stream, output);
}